

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall IntegerType::IntegerType(IntegerType *this,IntegerType *other)

{
  TypeKind kind;
  Type *in_RSI;
  Type *in_RDI;
  
  kind = Type::getKind(in_RSI);
  Type::Type(in_RDI,kind);
  in_RDI->_vptr_Type = (_func_int **)&PTR__IntegerType_003008f0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 1));
  *(byte *)&in_RDI[3]._vptr_Type = *(byte *)&in_RSI[3]._vptr_Type & 1;
  return;
}

Assistant:

IntegerType::IntegerType(const IntegerType& other): Type(other.getKind()) {
    name = other.name;
    unsignedType = other.unsignedType;
}